

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O1

int __thiscall
QEasingCurveFunction::copy(QEasingCurveFunction *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  qreal qVar1;
  Type TVar2;
  qreal qVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x58);
  TVar2 = this->_t;
  qVar1 = this->_o;
  *puVar4 = &PTR__QEasingCurveFunction_006afb20;
  *(Type *)(puVar4 + 1) = TVar2;
  qVar3 = this->_a;
  puVar4[2] = this->_p;
  puVar4[3] = qVar3;
  puVar4[4] = qVar1;
  puVar4[9] = 0;
  puVar4[10] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  QArrayDataPointer<QPointF>::operator=
            ((QArrayDataPointer<QPointF> *)(puVar4 + 5),&(this->_bezierCurves).d);
  QArrayDataPointer<TCBPoint>::operator=
            ((QArrayDataPointer<TCBPoint> *)(puVar4 + 8),&(this->_tcbPoints).d);
  return (int)puVar4;
}

Assistant:

QEasingCurveFunction *QEasingCurveFunction::copy() const
{
    QEasingCurveFunction *rv = new QEasingCurveFunction(_t, _p, _a, _o);
    rv->_bezierCurves = _bezierCurves;
    rv->_tcbPoints = _tcbPoints;
    return rv;
}